

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O1

Gia_Man_t * Gia_ManCheckFalse(Gia_Man_t *p,int nSlackMax,int nTimeOut,int fVerbose,int fVeryVerbose)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p_00;
  int *__ptr;
  void *__s;
  Vec_Int_t *pVVar5;
  Gia_Man_t *p_01;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  uint local_48;
  
  p_00 = Gia_ManDup(p);
  iVar3 = p_00->vCos->nSize;
  __ptr = (int *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar4 = iVar3;
  }
  __ptr[1] = 0;
  *__ptr = iVar4;
  if (iVar4 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar4 << 2);
  }
  *(void **)(__ptr + 2) = __s;
  __ptr[1] = iVar3;
  if (__s != (void *)0x0) {
    memset(__s,0,(long)iVar3 << 2);
  }
  local_48 = 0;
  uVar9 = 0;
  do {
    iVar3 = Gia_ManLevelNum(p_00);
    pVVar5 = p_00->vCos;
    uVar10 = uVar9;
    if (0 < pVVar5->nSize) {
      lVar8 = 0;
      do {
        iVar4 = pVVar5->pArray[lVar8];
        if (((long)iVar4 < 0) || (p_00->nObjs <= iVar4)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar2 = p_00->pObjs;
        if (pGVar2 == (Gia_Obj_t *)0x0) break;
        pGVar1 = pGVar2 + iVar4;
        uVar6 = (ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
        if ((~*(uint *)(pGVar1 + -uVar6) & 0x1fffffff) != 0 && -1 < (int)*(uint *)(pGVar1 + -uVar6))
        {
          pGVar7 = pGVar1 + -uVar6;
          if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) {
LAB_0073447e:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar4 = Gia_ObjLevelId(p_00,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555
                                );
          if (iVar3 - nSlackMax <= iVar4) {
            if (__ptr[1] <= lVar8) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (*(int *)(*(long *)(__ptr + 2) + lVar8 * 4) == 0) {
              pGVar2 = p_00->pObjs;
              if ((pGVar1 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar1)) goto LAB_0073447e;
              local_48 = local_48 + 1;
              p_01 = Gia_ManCheckOne(p_00,(int)lVar8,
                                     (int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555
                                     - (*(uint *)pGVar1 & 0x1fffffff),nTimeOut,fVerbose,fVeryVerbose
                                    );
              if (p_01 == (Gia_Man_t *)0x0) {
                if (__ptr[1] <= lVar8) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                *(undefined4 *)(*(long *)(__ptr + 2) + lVar8 * 4) = 1;
              }
              else {
                uVar10 = uVar10 + 1;
                Gia_ManStop(p_00);
                iVar3 = Gia_ManLevelNum(p_01);
                p_00 = p_01;
              }
            }
          }
        }
        lVar8 = lVar8 + 1;
        pVVar5 = p_00->vCos;
      } while (lVar8 < pVVar5->nSize);
    }
    bVar11 = uVar9 == uVar10;
    uVar9 = uVar10;
    if (bVar11) {
      printf("Performed %d attempts and %d changes.\n",(ulong)local_48,(ulong)uVar10);
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      return p_00;
    }
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManCheckFalse( Gia_Man_t * p, int nSlackMax, int nTimeOut, int fVerbose, int fVeryVerbose )
{
    int Tried = 0, Changed = 0;
    Vec_Int_t * vTried;
//    srand( 111 );
    p = Gia_ManDup( p );
    vTried = Vec_IntStart( Gia_ManCoNum(p) );
    while ( 1 )
    {
        Gia_Man_t * pNew;
        Gia_Obj_t * pObj;
        int i, LevelMax, Changed0 = Changed;
        LevelMax = Gia_ManLevelNum( p );
        Gia_ManForEachCo( p, pObj, i )
        {
            if ( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
                continue;
            if ( Gia_ObjLevel(p, Gia_ObjFanin0(pObj)) < LevelMax - nSlackMax )
                continue;
            if ( Vec_IntEntry( vTried, i ) )
                continue;
            Tried++;
            pNew = Gia_ManCheckOne( p, i, Gia_ObjFaninId0p(p, pObj), nTimeOut, fVerbose, fVeryVerbose );
/*
            if ( i != 126 && pNew )
            {
                Gia_ManStop( pNew );
                pNew = NULL;
            }
*/
            if ( pNew == NULL )
            {
                Vec_IntWriteEntry( vTried, i, 1 );
                continue;
            }
            Changed++;
            Gia_ManStop( p );
            p = pNew;
            LevelMax = Gia_ManLevelNum( p );
        }
        if ( Changed0 == Changed )
            break;
    }
//    if ( fVerbose )
        printf( "Performed %d attempts and %d changes.\n", Tried, Changed );
    Vec_IntFree( vTried );
    return p;
}